

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

void update_multiple_arg(void *field,char ***orig_field,uint field_given,uint prev_given,
                        generic_value *default_value,cmdline_parser_arg_type arg_type,
                        generic_list *list)

{
  undefined8 *__ptr;
  void *pvVar1;
  char *pcVar2;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  undefined8 *in_stack_00000008;
  generic_list *tmp;
  int i;
  char *in_stack_ffffffffffffffb8;
  int local_28;
  
  if ((in_ECX == 0) || (in_stack_00000008 == (undefined8 *)0x0)) {
    if ((in_R8 != (undefined8 *)0x0) && (in_EDX == 0)) {
      if (in_R9D == 1) {
        if (*in_RDI == 0) {
          pvVar1 = malloc(8);
          *in_RDI = (long)pvVar1;
          pcVar2 = gengetopt_strdup(in_stack_ffffffffffffffb8);
          *(char **)*in_RDI = pcVar2;
        }
      }
      else if ((in_R9D == 2) && (*in_RDI == 0)) {
        pvVar1 = malloc(8);
        *in_RDI = (long)pvVar1;
        *(undefined8 *)*in_RDI = *in_R8;
      }
      if (*in_RSI == 0) {
        pvVar1 = malloc(8);
        *in_RSI = (long)pvVar1;
        *(undefined8 *)*in_RSI = 0;
      }
    }
  }
  else {
    pvVar1 = realloc((void *)*in_RSI,(ulong)(uint)(in_EDX + in_ECX) << 3);
    *in_RSI = (long)pvVar1;
    if (in_R9D == 1) {
      pvVar1 = realloc((void *)*in_RDI,(ulong)(uint)(in_EDX + in_ECX) << 3);
      *in_RDI = (long)pvVar1;
    }
    else if (in_R9D == 2) {
      pvVar1 = realloc((void *)*in_RDI,(ulong)(uint)(in_EDX + in_ECX) << 3);
      *in_RDI = (long)pvVar1;
    }
    for (local_28 = in_ECX + -1; __ptr = in_stack_00000008, -1 < local_28; local_28 = local_28 + -1)
    {
      if (in_R9D == 1) {
        *(undefined8 *)(*in_RDI + (ulong)(uint)(local_28 + in_EDX) * 8) = *in_stack_00000008;
      }
      else if (in_R9D == 2) {
        *(undefined8 *)(*in_RDI + (ulong)(uint)(local_28 + in_EDX) * 8) = *in_stack_00000008;
      }
      *(undefined8 *)(*in_RSI + (ulong)(uint)(local_28 + in_EDX) * 8) = in_stack_00000008[1];
      in_stack_00000008 = (undefined8 *)in_stack_00000008[2];
      free(__ptr);
    }
  }
  return;
}

Assistant:

static
void update_multiple_arg(void *field, char ***orig_field,
               unsigned int field_given, unsigned int prev_given, union generic_value *default_value,
               cmdline_parser_arg_type arg_type,
               struct generic_list *list)
{
  int i;
  struct generic_list *tmp;

  if (prev_given && list) {
    *orig_field = (char **) realloc (*orig_field, (field_given + prev_given) * sizeof (char *));

    switch(arg_type) {
    case ARG_DOUBLE:
      *((double **)field) = (double *)realloc (*((double **)field), (field_given + prev_given) * sizeof (double)); break;
    case ARG_STRING:
      *((char ***)field) = (char **)realloc (*((char ***)field), (field_given + prev_given) * sizeof (char *)); break;
    default:
      break;
    };
    
    for (i = (prev_given - 1); i >= 0; --i)
      {
        tmp = list;
        
        switch(arg_type) {
        case ARG_DOUBLE:
          (*((double **)field))[i + field_given] = tmp->arg.double_arg; break;
        case ARG_STRING:
          (*((char ***)field))[i + field_given] = tmp->arg.string_arg; break;
        default:
          break;
        }        
        (*orig_field) [i + field_given] = list->orig;
        list = list->next;
        free (tmp);
      }
  } else { /* set the default value */
    if (default_value && ! field_given) {
      switch(arg_type) {
      case ARG_DOUBLE:
        if (! *((double **)field)) {
          *((double **)field) = (double *)malloc (sizeof (double));
          (*((double **)field))[0] = default_value->double_arg;
        }
        break;
      case ARG_STRING:
        if (! *((char ***)field)) {
          *((char ***)field) = (char **)malloc (sizeof (char *));
          (*((char ***)field))[0] = gengetopt_strdup(default_value->string_arg);
        }
        break;
      default: break;
      }
      if (!(*orig_field)) {
        *orig_field = (char **) malloc (sizeof (char *));
        (*orig_field)[0] = 0;
      }
    }
  }
}